

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O1

void ActionUnserialize::SerReadWriteMany<DataStream,int&,unsigned_int&,CKeyID&>
               (DataStream *s,int *args,uint *args_1,CKeyID *args_2)

{
  CKeyID *__nbytes;
  long in_FS_OFFSET;
  uint32_t obj;
  uint local_34;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  __nbytes = args_2;
  DataStream::read(s,(int)&local_34,(void *)0x4,(size_t)args_2);
  *args = local_34;
  DataStream::read(s,(int)&local_34,(void *)0x4,(size_t)__nbytes);
  *args_1 = local_34;
  DataStream::read(s,(int)args_2,(void *)0x14,(size_t)__nbytes);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void SerReadWriteMany(Stream& s, Args&&... args)
    {
        ::UnserializeMany(s, args...);
    }